

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O3

UChar32 anon_unknown.dwarf_3019ed::getRange
                  (void *trie,UChar32 start,UCPMapValueFilter *filter,void *context,uint32_t *pValue
                  )

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  long lVar5;
  int iVar6;
  uint32_t unaff_R14D;
  UChar32 UVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  UVar7 = -1;
  if ((uint)start < 0x110000) {
    if (start < *(int *)((long)trie + 0x30)) {
      uVar2 = *(uint32_t *)((long)trie + 0x28);
      if (filter != (UCPMapValueFilter *)0x0) {
        uVar2 = (*filter)(context,uVar2);
      }
      uVar8 = (ulong)((uint)start >> 4);
      bVar10 = false;
      do {
        uVar1 = *(uint32_t *)(*trie + uVar8 * 4);
        if (*(char *)((long)trie + uVar8 + 0x40) == '\0') {
          uVar3 = uVar1;
          if (uVar1 == *(uint32_t *)((long)trie + 0x28)) {
            uVar3 = uVar2;
          }
          if ((filter != (UCPMapValueFilter *)0x0) && (uVar1 != *(uint32_t *)((long)trie + 0x28))) {
            uVar3 = (*filter)(context,uVar1);
          }
          if (bVar10) {
            bVar9 = uVar3 != unaff_R14D;
            uVar3 = unaff_R14D;
            if (bVar9) goto LAB_002e02b3;
          }
          else {
            bVar10 = true;
            if (pValue != (uint32_t *)0x0) {
              *pValue = uVar3;
            }
          }
          start = (start & 0xfffffff0U) + 0x10;
          unaff_R14D = uVar3;
        }
        else {
          lVar5 = (long)(int)(uVar1 + (start & 0xfU));
          uVar1 = *(uint32_t *)(*(long *)((long)trie + 0x10) + lVar5 * 4);
          uVar3 = uVar1;
          if (uVar1 == *(uint32_t *)((long)trie + 0x28)) {
            uVar3 = uVar2;
          }
          if ((filter != (UCPMapValueFilter *)0x0) && (uVar1 != *(uint32_t *)((long)trie + 0x28))) {
            uVar3 = (*filter)(context,uVar1);
          }
          if (bVar10) {
            bVar9 = uVar3 != unaff_R14D;
            uVar3 = unaff_R14D;
            if (bVar9) {
LAB_002e02b3:
              return start - 1;
            }
          }
          else {
            bVar10 = true;
            if (pValue != (uint32_t *)0x0) {
              *pValue = uVar3;
            }
          }
          iVar6 = start - 1;
          while( true ) {
            lVar5 = lVar5 + 1;
            start = iVar6 + 2;
            unaff_R14D = uVar3;
            if ((start & 0xfU) == 0) break;
            uVar1 = *(uint32_t *)(*(long *)((long)trie + 0x10) + lVar5 * 4);
            uVar4 = uVar1;
            if (uVar1 == *(uint32_t *)((long)trie + 0x28)) {
              uVar4 = uVar2;
            }
            if ((filter != (UCPMapValueFilter *)0x0) && (uVar1 != *(uint32_t *)((long)trie + 0x28)))
            {
              uVar4 = (*filter)(context,uVar1);
            }
            iVar6 = iVar6 + 1;
            if (uVar4 != uVar3) {
              return iVar6;
            }
          }
        }
        uVar8 = uVar8 + 1;
      } while (start < *(int *)((long)trie + 0x30));
      uVar1 = *(uint32_t *)((long)trie + 0x34);
      bVar10 = uVar1 != *(uint32_t *)((long)trie + 0x28);
      if (bVar10) {
        uVar2 = uVar1;
      }
      if (bVar10 && filter != (UCPMapValueFilter *)0x0) {
        uVar2 = (*filter)(context,uVar1);
      }
      UVar7 = 0x10ffff;
      if (uVar2 != unaff_R14D) {
        UVar7 = start - 1;
      }
    }
    else {
      UVar7 = 0x10ffff;
      if (pValue != (uint32_t *)0x0) {
        uVar2 = *(uint32_t *)((long)trie + 0x34);
        if (filter != (UCPMapValueFilter *)0x0) {
          uVar2 = (*filter)(context,uVar2);
        }
        *pValue = uVar2;
      }
    }
  }
  return UVar7;
}

Assistant:

UChar32 getRange(const void *trie, UChar32 start,
                 UCPMapValueFilter *filter, const void *context, uint32_t *pValue) {
    return reinterpret_cast<const MutableCodePointTrie *>(trie)->
        getRange(start, filter, context, pValue);
}